

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O0

void omp_target_free(void *device_ptr,int device_num)

{
  bool bVar1;
  int iVar2;
  reference TgtPtrBegin;
  int in_ESI;
  void *in_RDI;
  DeviceTy *Device;
  int in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  int iVar3;
  
  if (in_RDI != (void *)0x0) {
    iVar3 = in_ESI;
    iVar2 = omp_get_initial_device();
    if (in_ESI == iVar2) {
      free(in_RDI);
    }
    else {
      bVar1 = device_is_ready(in_stack_ffffffffffffffe0);
      if (bVar1) {
        TgtPtrBegin = std::vector<DeviceTy,_std::allocator<DeviceTy>_>::operator[]
                                (&Devices,(long)iVar3);
        DeviceTy::data_delete((DeviceTy *)CONCAT44(iVar3,in_stack_fffffffffffffff0),TgtPtrBegin);
      }
    }
  }
  return;
}

Assistant:

EXTERN void omp_target_free(void *device_ptr, int device_num) {
  DP("Call to omp_target_free for device %d and address " DPxMOD "\n",
      device_num, DPxPTR(device_ptr));

  if (!device_ptr) {
    DP("Call to omp_target_free with NULL ptr\n");
    return;
  }

  if (device_num == omp_get_initial_device()) {
    free(device_ptr);
    DP("omp_target_free deallocated host ptr\n");
    return;
  }

  if (!device_is_ready(device_num)) {
    DP("omp_target_free returns, nothing to do\n");
    return;
  }

  DeviceTy &Device = Devices[device_num];

  Device.data_delete((void *)device_ptr);

  DP("omp_target_free deallocated device ptr\n");
}